

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_regtest.c
# Opt level: O3

ErrorNumber test_with_simulator(void)

{
  ErrorNumber EVar1;
  TA_History local_48;
  
  EVar1 = allocLib();
  if (EVar1 == TA_TEST_PASS) {
    local_48.nbBars = 0xfc;
    local_48.open = TA_SREF_open_daily_ref_0_PRIV;
    local_48.high = TA_SREF_high_daily_ref_0_PRIV;
    local_48.low = TA_SREF_low_daily_ref_0_PRIV;
    local_48.close = TA_SREF_close_daily_ref_0_PRIV;
    local_48.volume = TA_SREF_volume_daily_ref_0_PRIV;
    puts("Testing the TA functions");
    initGlobalBuffer();
    printf("%50s: Testing....","MATH,VECTOR,DCPERIOD/PHASE,TRENDLINE/MODE");
    fflush(_stdout);
    showFeedback();
    TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
    EVar1 = test_func_1in_1out(&local_48);
    if (EVar1 == TA_TEST_PASS) {
      hideFeedback();
      puts("done.");
      fflush(_stdout);
      printf("%50s: Testing....","All Moving Averages");
      fflush(_stdout);
      showFeedback();
      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
      EVar1 = test_func_ma(&local_48);
      if (EVar1 == TA_TEST_PASS) {
        hideFeedback();
        puts("done.");
        fflush(_stdout);
        printf("%50s: Testing....","AROON,CORREL,BETA");
        fflush(_stdout);
        showFeedback();
        TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
        EVar1 = test_func_per_hl(&local_48);
        if (EVar1 == TA_TEST_PASS) {
          hideFeedback();
          puts("done.");
          fflush(_stdout);
          printf("%50s: Testing....","CCI,WILLR,ULTOSC,NATR");
          fflush(_stdout);
          showFeedback();
          TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
          EVar1 = test_func_per_hlc(&local_48);
          if (EVar1 == TA_TEST_PASS) {
            hideFeedback();
            puts("done.");
            fflush(_stdout);
            printf("%50s: Testing....","BOP,AVGPRICE");
            fflush(_stdout);
            showFeedback();
            TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
            EVar1 = test_func_per_ohlc(&local_48);
            if (EVar1 == TA_TEST_PASS) {
              hideFeedback();
              puts("done.");
              fflush(_stdout);
              printf("%50s: Testing....","RSI,CMO");
              fflush(_stdout);
              showFeedback();
              TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
              EVar1 = test_func_rsi(&local_48);
              if (EVar1 == TA_TEST_PASS) {
                hideFeedback();
                puts("done.");
                fflush(_stdout);
                printf("%50s: Testing....","IMI");
                fflush(_stdout);
                showFeedback();
                TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                EVar1 = test_func_imi(&local_48);
                if (EVar1 == TA_TEST_PASS) {
                  hideFeedback();
                  puts("done.");
                  fflush(_stdout);
                  printf("%50s: Testing....","MIN,MAX,MININDEX,MAXINDEX,MINMAX,MINMAXINDEX");
                  fflush(_stdout);
                  showFeedback();
                  TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                  EVar1 = test_func_minmax(&local_48);
                  if (EVar1 == TA_TEST_PASS) {
                    hideFeedback();
                    puts("done.");
                    fflush(_stdout);
                    printf("%50s: Testing....","PO,APO");
                    fflush(_stdout);
                    showFeedback();
                    TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                    EVar1 = test_func_po(&local_48);
                    if (EVar1 == TA_TEST_PASS) {
                      hideFeedback();
                      puts("done.");
                      fflush(_stdout);
                      printf("%50s: Testing....","ADX,ADXR,DI,DM,DX");
                      fflush(_stdout);
                      showFeedback();
                      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                      EVar1 = test_func_adx(&local_48);
                      if (EVar1 == TA_TEST_PASS) {
                        hideFeedback();
                        puts("done.");
                        fflush(_stdout);
                        printf("%50s: Testing....","SAR,SAREXT");
                        fflush(_stdout);
                        showFeedback();
                        TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                        EVar1 = test_func_sar(&local_48);
                        if (EVar1 == TA_TEST_PASS) {
                          hideFeedback();
                          puts("done.");
                          fflush(_stdout);
                          printf("%50s: Testing....","STOCH,STOCHF,STOCHRSI");
                          fflush(_stdout);
                          showFeedback();
                          TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                          EVar1 = test_func_stoch(&local_48);
                          if (EVar1 == TA_TEST_PASS) {
                            hideFeedback();
                            puts("done.");
                            fflush(_stdout);
                            printf("%50s: Testing....","MFI,AD,ADOSC");
                            fflush(_stdout);
                            showFeedback();
                            TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                            EVar1 = test_func_per_hlcv(&local_48);
                            if (EVar1 == TA_TEST_PASS) {
                              hideFeedback();
                              puts("done.");
                              fflush(_stdout);
                              printf("%50s: Testing....","PHASOR,SINE");
                              fflush(_stdout);
                              showFeedback();
                              TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                              EVar1 = test_func_1in_2out(&local_48);
                              if (EVar1 == TA_TEST_PASS) {
                                hideFeedback();
                                puts("done.");
                                fflush(_stdout);
                                printf("%50s: Testing....","TRIX");
                                fflush(_stdout);
                                showFeedback();
                                TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                                EVar1 = test_func_per_ema(&local_48);
                                if (EVar1 == TA_TEST_PASS) {
                                  hideFeedback();
                                  puts("done.");
                                  fflush(_stdout);
                                  printf("%50s: Testing....","MACD,MACDFIX,MACDEXT");
                                  fflush(_stdout);
                                  showFeedback();
                                  TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                                  EVar1 = test_func_macd(&local_48);
                                  if (EVar1 == TA_TEST_PASS) {
                                    hideFeedback();
                                    puts("done.");
                                    fflush(_stdout);
                                    printf("%50s: Testing....","MOM,ROC,ROCP,ROCR,ROCR100");
                                    fflush(_stdout);
                                    showFeedback();
                                    TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                                    EVar1 = test_func_mom_roc(&local_48);
                                    if (EVar1 == TA_TEST_PASS) {
                                      hideFeedback();
                                      puts("done.");
                                      fflush(_stdout);
                                      printf("%50s: Testing....","TRANGE,ATR");
                                      fflush(_stdout);
                                      showFeedback();
                                      TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                                      EVar1 = test_func_trange(&local_48);
                                      if (EVar1 == TA_TEST_PASS) {
                                        hideFeedback();
                                        puts("done.");
                                        fflush(_stdout);
                                        printf("%50s: Testing....","STDDEV,VAR");
                                        fflush(_stdout);
                                        showFeedback();
                                        TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                                        EVar1 = test_func_stddev(&local_48);
                                        if (EVar1 == TA_TEST_PASS) {
                                          hideFeedback();
                                          puts("done.");
                                          fflush(_stdout);
                                          printf("%50s: Testing....","AVGDEV");
                                          fflush(_stdout);
                                          showFeedback();
                                          TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                                          EVar1 = test_func_avgdev(&local_48);
                                          if (EVar1 == TA_TEST_PASS) {
                                            hideFeedback();
                                            puts("done.");
                                            fflush(_stdout);
                                            printf("%50s: Testing....","BBANDS");
                                            fflush(_stdout);
                                            showFeedback();
                                            TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                                            EVar1 = test_func_bbands(&local_48);
                                            if (EVar1 == TA_TEST_PASS) {
                                              hideFeedback();
                                              puts("done.");
                                              fflush(_stdout);
                                              printf("%50s: Testing....","All Candlesticks");
                                              fflush(_stdout);
                                              showFeedback();
                                              TA_SetCompatibility(TA_COMPATIBILITY_DEFAULT);
                                              EVar1 = test_candlestick(&local_48);
                                              if (EVar1 == TA_TEST_PASS) {
                                                hideFeedback();
                                                puts("done.");
                                                fflush(_stdout);
                                                EVar1 = freeLib();
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar1;
}

Assistant:

static ErrorNumber test_with_simulator( void )
{
   ErrorNumber retValue;

   /* Initialize the library. */
   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Perform testing of each of the TA Functions. */
   retValue = testTAFunction_ALL();
   if( retValue != TA_TEST_PASS )
   {
      return retValue;
   }

   /* Clean-up and exit. */

   retValue = freeLib( );
   if( retValue != TA_TEST_PASS )
      return retValue;

   return TA_TEST_PASS; /* All test succeed. */
}